

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  char cVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  undefined4 uVar41;
  ulong unaff_RBP;
  NodeRef *pNVar42;
  NodeRef *pNVar43;
  ulong uVar44;
  ulong uVar45;
  size_t sVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 extraout_var [56];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar64 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar65 [64];
  float fVar66;
  undefined1 in_ZMM14 [64];
  undefined1 auVar67 [32];
  vint8 bi_1;
  vint8 bi;
  NodeRef stack [564];
  
  stack[0] = root;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar54._4_4_ = fVar7;
  auVar54._0_4_ = fVar7;
  auVar54._8_4_ = fVar7;
  auVar54._12_4_ = fVar7;
  auVar54._16_4_ = fVar7;
  auVar54._20_4_ = fVar7;
  auVar54._24_4_ = fVar7;
  auVar54._28_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar55._4_4_ = fVar8;
  auVar55._0_4_ = fVar8;
  auVar55._8_4_ = fVar8;
  auVar55._12_4_ = fVar8;
  auVar55._16_4_ = fVar8;
  auVar55._20_4_ = fVar8;
  auVar55._24_4_ = fVar8;
  auVar55._28_4_ = fVar8;
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar57._4_4_ = fVar66;
  auVar57._0_4_ = fVar66;
  auVar57._8_4_ = fVar66;
  auVar57._12_4_ = fVar66;
  auVar57._16_4_ = fVar66;
  auVar57._20_4_ = fVar66;
  auVar57._24_4_ = fVar66;
  auVar57._28_4_ = fVar66;
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar9 = (tray->tnear).field_0.i[k];
  auVar58._4_4_ = iVar9;
  auVar58._0_4_ = iVar9;
  auVar58._8_4_ = iVar9;
  auVar58._12_4_ = iVar9;
  auVar58._16_4_ = iVar9;
  auVar58._20_4_ = iVar9;
  auVar58._24_4_ = iVar9;
  auVar58._28_4_ = iVar9;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar59._4_4_ = iVar10;
  auVar59._0_4_ = iVar10;
  auVar59._8_4_ = iVar10;
  auVar59._12_4_ = iVar10;
  auVar59._16_4_ = iVar10;
  auVar59._20_4_ = iVar10;
  auVar59._24_4_ = iVar10;
  auVar59._28_4_ = iVar10;
  auVar60._0_4_ = fVar7 * -fVar1;
  auVar60._4_4_ = fVar7 * -fVar1;
  auVar60._8_4_ = fVar7 * -fVar1;
  auVar60._12_4_ = fVar7 * -fVar1;
  auVar60._16_4_ = fVar7 * -fVar1;
  auVar60._20_4_ = fVar7 * -fVar1;
  auVar60._28_36_ = in_ZMM10._28_36_;
  auVar60._24_4_ = fVar7 * -fVar1;
  uVar37 = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar50 = ZEXT3264(CONCAT428(-fVar2,CONCAT424(-fVar2,CONCAT420(-fVar2,CONCAT416(-fVar2,CONCAT412(-
                                                  fVar2,CONCAT48(-fVar2,uVar37)))))));
  auVar62._0_4_ = fVar8 * -fVar2;
  auVar62._4_4_ = fVar8 * (float)(uVar37 >> 0x20);
  auVar62._8_4_ = fVar8 * -fVar2;
  auVar62._12_4_ = fVar8 * -fVar2;
  auVar62._16_4_ = fVar8 * -fVar2;
  auVar62._20_4_ = fVar8 * -fVar2;
  auVar62._28_36_ = in_ZMM11._28_36_;
  auVar62._24_4_ = fVar8 * -fVar2;
  auVar64._0_4_ = fVar66 * -fVar3;
  auVar64._4_4_ = fVar66 * -fVar3;
  auVar64._8_4_ = fVar66 * -fVar3;
  auVar64._12_4_ = fVar66 * -fVar3;
  auVar64._16_4_ = fVar66 * -fVar3;
  auVar64._20_4_ = fVar66 * -fVar3;
  auVar64._28_36_ = in_ZMM12._28_36_;
  auVar64._24_4_ = fVar66 * -fVar3;
  pNVar43 = stack + 1;
  do {
    pNVar42 = pNVar43;
    if (pNVar42 == stack) break;
    pNVar43 = pNVar42 + -1;
    sVar46 = pNVar42[-1].ptr;
    do {
      if ((sVar46 & 8) == 0) {
        fVar7 = *(float *)(ray + k * 4 + 0x70);
        uVar38 = (uint)sVar46 & 7;
        uVar37 = sVar46 & 0xfffffffffffffff0;
        if (uVar38 == 3) {
          auVar15 = *(undefined1 (*) [32])(uVar37 + 0x100);
          auVar16 = *(undefined1 (*) [32])(uVar37 + 0x120);
          fVar8 = 1.0 - fVar7;
          auVar33._4_4_ = fVar7 * *(float *)(uVar37 + 0x1c4);
          auVar33._0_4_ = fVar7 * *(float *)(uVar37 + 0x1c0);
          auVar33._8_4_ = fVar7 * *(float *)(uVar37 + 0x1c8);
          auVar33._12_4_ = fVar7 * *(float *)(uVar37 + 0x1cc);
          auVar33._16_4_ = fVar7 * *(float *)(uVar37 + 0x1d0);
          auVar33._20_4_ = fVar7 * *(float *)(uVar37 + 0x1d4);
          auVar33._24_4_ = fVar7 * *(float *)(uVar37 + 0x1d8);
          auVar33._28_4_ = iVar9;
          auVar65._0_4_ = fVar7 * *(float *)(uVar37 + 0x1e0);
          auVar65._4_4_ = fVar7 * *(float *)(uVar37 + 0x1e4);
          auVar65._8_4_ = fVar7 * *(float *)(uVar37 + 0x1e8);
          auVar65._12_4_ = fVar7 * *(float *)(uVar37 + 0x1ec);
          auVar65._16_4_ = fVar7 * *(float *)(uVar37 + 0x1f0);
          auVar65._20_4_ = fVar7 * *(float *)(uVar37 + 500);
          auVar65._28_36_ = in_ZMM13._28_36_;
          auVar65._24_4_ = fVar7 * *(float *)(uVar37 + 0x1f8);
          auVar51._0_4_ = fVar7 * *(float *)(uVar37 + 0x200);
          auVar51._4_4_ = fVar7 * *(float *)(uVar37 + 0x204);
          auVar51._8_4_ = fVar7 * *(float *)(uVar37 + 0x208);
          auVar51._12_4_ = fVar7 * *(float *)(uVar37 + 0x20c);
          auVar51._16_4_ = fVar7 * *(float *)(uVar37 + 0x210);
          auVar51._20_4_ = fVar7 * *(float *)(uVar37 + 0x214);
          auVar51._28_36_ = auVar50._28_36_;
          auVar51._24_4_ = fVar7 * *(float *)(uVar37 + 0x218);
          auVar52._4_4_ = fVar8;
          auVar52._0_4_ = fVar8;
          auVar52._8_4_ = fVar8;
          auVar52._12_4_ = fVar8;
          auVar52._16_4_ = fVar8;
          auVar52._20_4_ = fVar8;
          auVar52._24_4_ = fVar8;
          auVar52._28_4_ = fVar8;
          auVar48._0_12_ = ZEXT812(0);
          auVar48._12_4_ = 0;
          auVar22 = vfmadd231ps_fma(auVar33,auVar52,ZEXT1632(auVar48));
          auVar23 = vfmadd231ps_fma(auVar65._0_32_,auVar52,ZEXT1632(auVar48));
          in_ZMM13 = ZEXT1664(auVar23);
          auVar24 = vfmadd231ps_fma(auVar51._0_32_,auVar52,ZEXT1632(auVar48));
          auVar34._4_4_ = fVar6 * auVar15._4_4_;
          auVar34._0_4_ = fVar6 * auVar15._0_4_;
          auVar34._8_4_ = fVar6 * auVar15._8_4_;
          auVar34._12_4_ = fVar6 * auVar15._12_4_;
          auVar34._16_4_ = fVar6 * auVar15._16_4_;
          auVar34._20_4_ = fVar6 * auVar15._20_4_;
          auVar34._24_4_ = fVar6 * auVar15._24_4_;
          auVar34._28_4_ = iVar10;
          auVar35._4_4_ = fVar6 * auVar16._4_4_;
          auVar35._0_4_ = fVar6 * auVar16._0_4_;
          auVar35._8_4_ = fVar6 * auVar16._8_4_;
          auVar35._12_4_ = fVar6 * auVar16._12_4_;
          auVar35._16_4_ = fVar6 * auVar16._16_4_;
          auVar35._20_4_ = fVar6 * auVar16._20_4_;
          auVar35._24_4_ = fVar6 * auVar16._24_4_;
          auVar35._28_4_ = in_ZMM10._28_4_;
          auVar31._4_4_ = uVar5;
          auVar31._0_4_ = uVar5;
          auVar31._8_4_ = uVar5;
          auVar31._12_4_ = uVar5;
          auVar31._16_4_ = uVar5;
          auVar31._20_4_ = uVar5;
          auVar31._24_4_ = uVar5;
          auVar31._28_4_ = uVar5;
          auVar48 = vfmadd231ps_fma(auVar34,auVar31,*(undefined1 (*) [32])(uVar37 + 0xa0));
          auVar19 = vfmadd231ps_fma(auVar35,auVar31,*(undefined1 (*) [32])(uVar37 + 0xc0));
          auVar32._4_4_ = uVar4;
          auVar32._0_4_ = uVar4;
          auVar32._8_4_ = uVar4;
          auVar32._12_4_ = uVar4;
          auVar32._16_4_ = uVar4;
          auVar32._20_4_ = uVar4;
          auVar32._24_4_ = uVar4;
          auVar32._28_4_ = uVar4;
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar32,*(undefined1 (*) [32])(uVar37 + 0x40))
          ;
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar32,*(undefined1 (*) [32])(uVar37 + 0x60))
          ;
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          auVar67._16_4_ = 0x7fffffff;
          auVar67._20_4_ = 0x7fffffff;
          auVar67._24_4_ = 0x7fffffff;
          auVar67._28_4_ = 0x7fffffff;
          auVar17 = vandps_avx(ZEXT1632(auVar48),auVar67);
          auVar56._8_4_ = 0x219392ef;
          auVar56._0_8_ = 0x219392ef219392ef;
          auVar56._12_4_ = 0x219392ef;
          auVar56._16_4_ = 0x219392ef;
          auVar56._20_4_ = 0x219392ef;
          auVar56._24_4_ = 0x219392ef;
          auVar56._28_4_ = 0x219392ef;
          auVar17 = vcmpps_avx(auVar17,auVar56,1);
          auVar12 = vblendvps_avx(ZEXT1632(auVar48),auVar56,auVar17);
          auVar17 = vandps_avx(ZEXT1632(auVar19),auVar67);
          auVar17 = vcmpps_avx(auVar17,auVar56,1);
          auVar13 = vblendvps_avx(ZEXT1632(auVar19),auVar56,auVar17);
          fVar66 = in_ZMM14._28_4_;
          auVar63._0_4_ = fVar7 * *(float *)(uVar37 + 0x240) + fVar8;
          auVar63._4_4_ = fVar7 * *(float *)(uVar37 + 0x244) + fVar8;
          auVar63._8_4_ = fVar7 * *(float *)(uVar37 + 0x248) + fVar8;
          auVar63._12_4_ = fVar7 * *(float *)(uVar37 + 0x24c) + fVar8;
          auVar63._16_4_ = fVar7 * *(float *)(uVar37 + 0x250) + fVar8;
          auVar63._20_4_ = fVar7 * *(float *)(uVar37 + 0x254) + fVar8;
          auVar63._24_4_ = fVar7 * *(float *)(uVar37 + 600) + fVar8;
          auVar63._28_4_ = auVar17._28_4_ + fVar8;
          auVar61._0_4_ = fVar7 * *(float *)(uVar37 + 0x260) + fVar8;
          auVar61._4_4_ = fVar7 * *(float *)(uVar37 + 0x264) + fVar8;
          auVar61._8_4_ = fVar7 * *(float *)(uVar37 + 0x268) + fVar8;
          auVar61._12_4_ = fVar7 * *(float *)(uVar37 + 0x26c) + fVar8;
          auVar61._16_4_ = fVar7 * *(float *)(uVar37 + 0x270) + fVar8;
          auVar61._20_4_ = fVar7 * *(float *)(uVar37 + 0x274) + fVar8;
          auVar61._24_4_ = fVar7 * *(float *)(uVar37 + 0x278) + fVar8;
          auVar61._28_4_ = fVar7 + fVar8;
          auVar17 = *(undefined1 (*) [32])(uVar37 + 0x140);
          auVar11._4_4_ = auVar17._4_4_ * fVar6;
          auVar11._0_4_ = auVar17._0_4_ * fVar6;
          auVar11._8_4_ = auVar17._8_4_ * fVar6;
          auVar11._12_4_ = auVar17._12_4_ * fVar6;
          auVar11._16_4_ = auVar17._16_4_ * fVar6;
          auVar11._20_4_ = auVar17._20_4_ * fVar6;
          auVar11._24_4_ = auVar17._24_4_ * fVar6;
          auVar11._28_4_ = fVar6;
          auVar48 = vfmadd231ps_fma(auVar11,auVar31,*(undefined1 (*) [32])(uVar37 + 0xe0));
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar32,*(undefined1 (*) [32])(uVar37 + 0x80))
          ;
          auVar11 = vandps_avx(auVar67,ZEXT1632(auVar48));
          auVar11 = vcmpps_avx(auVar11,auVar56,1);
          auVar14 = vrcpps_avx(auVar12);
          auVar11 = vblendvps_avx(ZEXT1632(auVar48),auVar56,auVar11);
          auVar53._8_4_ = 0x3f800000;
          auVar53._0_8_ = &DAT_3f8000003f800000;
          auVar53._12_4_ = 0x3f800000;
          auVar53._16_4_ = 0x3f800000;
          auVar53._20_4_ = 0x3f800000;
          auVar53._24_4_ = 0x3f800000;
          auVar53._28_4_ = 0x3f800000;
          auVar48 = vfnmadd213ps_fma(auVar12,auVar14,auVar53);
          auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar14,auVar14);
          auVar12 = vrcpps_avx(auVar13);
          auVar19 = vfnmadd213ps_fma(auVar13,auVar12,auVar53);
          auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar12,auVar12);
          auVar12 = vrcpps_avx(auVar11);
          auVar20 = vfnmadd213ps_fma(auVar11,auVar12,auVar53);
          auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar12,auVar12);
          auVar12._4_4_ = fVar3;
          auVar12._0_4_ = fVar3;
          auVar12._8_4_ = fVar3;
          auVar12._12_4_ = fVar3;
          auVar12._16_4_ = fVar3;
          auVar12._20_4_ = fVar3;
          auVar12._24_4_ = fVar3;
          auVar12._28_4_ = fVar3;
          auVar21 = vfmadd213ps_fma(auVar15,auVar12,*(undefined1 (*) [32])(uVar37 + 0x160));
          auVar15._4_4_ = fVar2;
          auVar15._0_4_ = fVar2;
          auVar15._8_4_ = fVar2;
          auVar15._12_4_ = fVar2;
          auVar15._16_4_ = fVar2;
          auVar15._20_4_ = fVar2;
          auVar15._24_4_ = fVar2;
          auVar15._28_4_ = fVar2;
          auVar25 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar15,*(undefined1 (*) [32])(uVar37 + 0xa0))
          ;
          auVar21 = vfmadd213ps_fma(auVar16,auVar12,*(undefined1 (*) [32])(uVar37 + 0x180));
          auVar26 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar15,*(undefined1 (*) [32])(uVar37 + 0xc0))
          ;
          auVar21 = vfmadd213ps_fma(auVar17,auVar12,*(undefined1 (*) [32])(uVar37 + 0x1a0));
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar15,*(undefined1 (*) [32])(uVar37 + 0xe0))
          ;
          auVar13._4_4_ = fVar1;
          auVar13._0_4_ = fVar1;
          auVar13._8_4_ = fVar1;
          auVar13._12_4_ = fVar1;
          auVar13._16_4_ = fVar1;
          auVar13._20_4_ = fVar1;
          auVar13._24_4_ = fVar1;
          auVar13._28_4_ = fVar1;
          auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar13,*(undefined1 (*) [32])(uVar37 + 0x40))
          ;
          auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar13,*(undefined1 (*) [32])(uVar37 + 0x60))
          ;
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar13,*(undefined1 (*) [32])(uVar37 + 0x80))
          ;
          in_ZMM14 = ZEXT1664(auVar21);
          auVar15 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar25));
          auVar16._4_4_ = fVar7 * *(float *)(uVar37 + 0x224) + fVar8;
          auVar16._0_4_ = fVar7 * *(float *)(uVar37 + 0x220) + fVar8;
          auVar16._8_4_ = fVar7 * *(float *)(uVar37 + 0x228) + fVar8;
          auVar16._12_4_ = fVar7 * *(float *)(uVar37 + 0x22c) + fVar8;
          auVar16._16_4_ = fVar7 * *(float *)(uVar37 + 0x230) + fVar8;
          auVar16._20_4_ = fVar7 * *(float *)(uVar37 + 0x234) + fVar8;
          auVar16._24_4_ = fVar7 * *(float *)(uVar37 + 0x238) + fVar8;
          auVar16._28_4_ = fVar66 + fVar8;
          auVar16 = vsubps_avx(auVar16,ZEXT1632(auVar25));
          auVar17 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar26));
          auVar11 = vsubps_avx(auVar63,ZEXT1632(auVar26));
          auVar12 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar21));
          auVar13 = vsubps_avx(auVar61,ZEXT1632(auVar21));
          auVar14._4_4_ = auVar48._4_4_ * auVar15._4_4_;
          auVar14._0_4_ = auVar48._0_4_ * auVar15._0_4_;
          auVar14._8_4_ = auVar48._8_4_ * auVar15._8_4_;
          auVar14._12_4_ = auVar48._12_4_ * auVar15._12_4_;
          auVar14._16_4_ = auVar15._16_4_ * 0.0;
          auVar14._20_4_ = auVar15._20_4_ * 0.0;
          auVar14._24_4_ = auVar15._24_4_ * 0.0;
          auVar14._28_4_ = auVar15._28_4_;
          auVar27._4_4_ = auVar48._4_4_ * auVar16._4_4_;
          auVar27._0_4_ = auVar48._0_4_ * auVar16._0_4_;
          auVar27._8_4_ = auVar48._8_4_ * auVar16._8_4_;
          auVar27._12_4_ = auVar48._12_4_ * auVar16._12_4_;
          auVar27._16_4_ = auVar16._16_4_ * 0.0;
          auVar27._20_4_ = auVar16._20_4_ * 0.0;
          auVar27._24_4_ = auVar16._24_4_ * 0.0;
          auVar27._28_4_ = auVar16._28_4_;
          auVar28._4_4_ = auVar19._4_4_ * auVar17._4_4_;
          auVar28._0_4_ = auVar19._0_4_ * auVar17._0_4_;
          auVar28._8_4_ = auVar19._8_4_ * auVar17._8_4_;
          auVar28._12_4_ = auVar19._12_4_ * auVar17._12_4_;
          auVar28._16_4_ = auVar17._16_4_ * 0.0;
          auVar28._20_4_ = auVar17._20_4_ * 0.0;
          auVar28._24_4_ = auVar17._24_4_ * 0.0;
          auVar28._28_4_ = auVar17._28_4_;
          auVar17._4_4_ = auVar20._4_4_ * auVar12._4_4_;
          auVar17._0_4_ = auVar20._0_4_ * auVar12._0_4_;
          auVar17._8_4_ = auVar20._8_4_ * auVar12._8_4_;
          auVar17._12_4_ = auVar20._12_4_ * auVar12._12_4_;
          auVar17._16_4_ = auVar12._16_4_ * 0.0;
          auVar17._20_4_ = auVar12._20_4_ * 0.0;
          auVar17._24_4_ = auVar12._24_4_ * 0.0;
          auVar17._28_4_ = auVar12._28_4_;
          auVar29._4_4_ = auVar19._4_4_ * auVar11._4_4_;
          auVar29._0_4_ = auVar19._0_4_ * auVar11._0_4_;
          auVar29._8_4_ = auVar19._8_4_ * auVar11._8_4_;
          auVar29._12_4_ = auVar19._12_4_ * auVar11._12_4_;
          auVar29._16_4_ = auVar11._16_4_ * 0.0;
          auVar29._20_4_ = auVar11._20_4_ * 0.0;
          auVar29._24_4_ = auVar11._24_4_ * 0.0;
          auVar29._28_4_ = auVar11._28_4_;
          auVar30._4_4_ = auVar20._4_4_ * auVar13._4_4_;
          auVar30._0_4_ = auVar20._0_4_ * auVar13._0_4_;
          auVar30._8_4_ = auVar20._8_4_ * auVar13._8_4_;
          auVar30._12_4_ = auVar20._12_4_ * auVar13._12_4_;
          auVar30._16_4_ = auVar13._16_4_ * 0.0;
          auVar30._20_4_ = auVar13._20_4_ * 0.0;
          auVar30._24_4_ = auVar13._24_4_ * 0.0;
          auVar30._28_4_ = auVar13._28_4_;
          auVar15 = vpminsd_avx2(auVar28,auVar29);
          auVar16 = vpminsd_avx2(auVar17,auVar30);
          auVar15 = vmaxps_avx(auVar15,auVar16);
          auVar12 = vpminsd_avx2(auVar14,auVar27);
          auVar11 = vpmaxsd_avx2(auVar14,auVar27);
          auVar16 = vpmaxsd_avx2(auVar28,auVar29);
          auVar17 = vpmaxsd_avx2(auVar17,auVar30);
          auVar17 = vminps_avx(auVar16,auVar17);
          auVar50 = ZEXT3264(auVar17);
          auVar16 = vmaxps_avx(auVar58,auVar12);
          auVar15 = vmaxps_avx(auVar16,auVar15);
          auVar16 = vminps_avx(auVar59,auVar11);
          auVar16 = vminps_avx(auVar16,auVar17);
          auVar15 = vcmpps_avx(auVar15,auVar16,2);
          uVar41 = vmovmskps_avx(auVar15);
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar41);
        }
        else {
          auVar49._4_4_ = fVar7;
          auVar49._0_4_ = fVar7;
          auVar49._8_4_ = fVar7;
          auVar49._12_4_ = fVar7;
          auVar49._16_4_ = fVar7;
          auVar49._20_4_ = fVar7;
          auVar49._24_4_ = fVar7;
          auVar49._28_4_ = fVar7;
          auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar44),auVar49,
                                    *(undefined1 (*) [32])(uVar37 + 0x40 + uVar44));
          auVar48 = vfmadd213ps_fma(ZEXT1632(auVar48),auVar54,auVar60._0_32_);
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar40),auVar49,
                                    *(undefined1 (*) [32])(uVar37 + 0x40 + uVar40));
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar55,auVar62._0_32_);
          auVar15 = vpmaxsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar19));
          auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar47),auVar49,
                                    *(undefined1 (*) [32])(uVar37 + 0x40 + uVar47));
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar44 ^ 0x20)),auVar49
                                    ,*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar44 ^ 0x20)));
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar54,auVar60._0_32_);
          auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar40 ^ 0x20)),auVar49
                                    ,*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar40 ^ 0x20)));
          auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar62._0_32_);
          auVar17 = vpminsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar20));
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar47 ^ 0x20)),auVar49
                                    ,*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar47 ^ 0x20)));
          auVar48 = vfmadd213ps_fma(ZEXT1632(auVar48),auVar57,auVar64._0_32_);
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar57,auVar64._0_32_);
          auVar16 = vpmaxsd_avx2(ZEXT1632(auVar48),auVar58);
          auVar15 = vpmaxsd_avx2(auVar15,auVar16);
          auVar16 = vpminsd_avx2(ZEXT1632(auVar19),auVar59);
          auVar16 = vpminsd_avx2(auVar17,auVar16);
          auVar15 = vcmpps_avx(auVar15,auVar16,2);
          auVar50 = ZEXT3264(auVar15);
          if (uVar38 == 6) {
            auVar16 = vcmpps_avx(*(undefined1 (*) [32])(uVar37 + 0x1c0),auVar49,2);
            auVar17 = vcmpps_avx(auVar49,*(undefined1 (*) [32])(uVar37 + 0x1e0),1);
            auVar16 = vandps_avx(auVar16,auVar17);
            auVar15 = vandps_avx(auVar16,auVar15);
            auVar50 = ZEXT1664(auVar15._16_16_);
            auVar48 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
          }
          else {
            auVar48 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
          }
          auVar48 = vpsllw_avx(auVar48,0xf);
          auVar48 = vpacksswb_avx(auVar48,auVar48);
          unaff_RBP = (ulong)(byte)(SUB161(auVar48 >> 7,0) & 1 | (SUB161(auVar48 >> 0xf,0) & 1) << 1
                                    | (SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                                    (SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                                    (SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                                    (SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                                    (SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                                   SUB161(auVar48 >> 0x3f,0) << 7);
        }
      }
      if ((sVar46 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar38 = 4;
        }
        else {
          uVar45 = sVar46 & 0xfffffffffffffff0;
          lVar39 = 0;
          for (uVar37 = unaff_RBP; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar39 = lVar39 + 1;
          }
          uVar38 = 0;
          for (uVar37 = unaff_RBP - 1 & unaff_RBP; sVar46 = *(size_t *)(uVar45 + lVar39 * 8),
              uVar37 != 0; uVar37 = uVar37 - 1 & uVar37) {
            pNVar43->ptr = sVar46;
            pNVar43 = pNVar43 + 1;
            lVar39 = 0;
            for (uVar18 = uVar37; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
          }
        }
      }
      else {
        uVar38 = 6;
      }
    } while (uVar38 == 0);
    if (uVar38 == 6) {
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
      cVar36 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar46 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      auVar50._8_56_ = extraout_var;
      auVar50._0_8_ = extraout_XMM1_Qa;
      uVar38 = 0;
      if (cVar36 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar38 = 1;
      }
    }
  } while ((uVar38 & 3) == 0);
  return pNVar42 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }